

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

SPIRBlock * __thiscall spirv_cross::Variant::get<spirv_cross::SPIRBlock>(Variant *this)

{
  runtime_error *prVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((SPIRBlock *)this->holder == (SPIRBlock *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nullptr","");
    ::std::runtime_error::runtime_error(prVar1,(string *)local_40);
    *(undefined ***)prVar1 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar1,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (this->type == TypeBlock) {
    return (SPIRBlock *)this->holder;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Bad cast","");
  ::std::runtime_error::runtime_error(prVar1,(string *)local_40);
  *(undefined ***)prVar1 = &PTR__runtime_error_00357118;
  __cxa_throw(prVar1,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

T &get()
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<T *>(holder);
	}